

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadPoints(XMLLoader *this,Ref<embree::XML> *xml,RTCGeometryType type)

{
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *this_00;
  PointSetNode *pPVar1;
  RTCGeometryType in_ECX;
  size_t siglen;
  undefined4 in_register_00000014;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *sig;
  uchar *extraout_RDX_03;
  uchar *extraout_RDX_04;
  uchar *extraout_RDX_05;
  uchar *extraout_RDX_06;
  uchar *extraout_RDX_07;
  ulong uVar2;
  string *psVar3;
  uchar *in_R8;
  size_t in_R9;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *this_01;
  Ref<embree::XML> animation;
  Ref<embree::XML> animation_1;
  Ref<embree::SceneGraph::MaterialNode> material;
  undefined1 local_a8 [8];
  string local_a0;
  PointSetNode *local_80;
  _Alloc_hider local_78;
  undefined1 local_70 [40];
  __atomic_base<unsigned_long> local_48;
  _Alloc_hider local_40;
  XMLLoader *local_38;
  
  local_78._M_p = (pointer)CONCAT44(in_register_00000014,type);
  psVar3 = *(string **)local_78._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a8 + 8),"material","");
  XML::child((XML *)local_70,psVar3);
  loadMaterial((XMLLoader *)&stack0xffffffffffffffc0,xml);
  if ((string *)local_70._0_8_ != (string *)0x0) {
    (**(code **)(((_Alloc_hider *)local_70._0_8_)->_M_p + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  pPVar1 = (PointSetNode *)operator_new(0xb0);
  local_48._M_i = (__int_type)local_40._M_p;
  local_80 = pPVar1;
  if ((_Base_ptr)local_40._M_p != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_40._M_p + 0x10))();
  }
  siglen = 0;
  SceneGraph::PointSetNode::PointSetNode
            (pPVar1,in_ECX,(Ref<embree::SceneGraph::MaterialNode> *)&local_48,
             (BBox1f)0x3f80000000000000,0);
  (*(pPVar1->super_Node).super_RefCount._vptr_RefCount[2])(pPVar1);
  if ((_Base_ptr)local_48._M_i != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_48._M_i + 0x18))();
  }
  psVar3 = *(string **)local_78._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a8 + 8),"animated_positions","");
  XML::childOpt((XML *)local_a8,psVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_a8 == (undefined1  [8])0x0) {
    psVar3 = *(string **)local_78._M_p;
    local_70._0_8_ = (string *)(local_70 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"positions","");
    XML::childOpt((XML *)(local_70 + 0x20),psVar3);
    loadVec3ffArray((avector<Vec3ff> *)(local_a8 + 8),(XMLLoader *)xml,
                    (Ref<embree::XML> *)(local_70 + 0x20));
    std::
    vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                *)&local_80->positions,
               (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
               (local_a8 + 8));
    alignedFree((void *)local_a0.field_2._8_8_);
    local_a0._M_string_length = 0;
    local_a0.field_2._M_allocated_capacity = 0;
    local_a0.field_2._8_8_ = (void *)0x0;
    if ((long *)local_70._32_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_70._32_8_ + 0x18))();
    }
    if ((string *)local_70._0_8_ != (string *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_);
    }
  }
  else if ((((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
            ((long)local_a8 + 0x80))->
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish !=
           (((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
            ((long)local_a8 + 0x80))->
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>)
           ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = &local_80->positions;
    uVar2 = 0;
    do {
      XML::child((XML *)local_70,(size_t)local_a8);
      loadVec3ffArray((avector<Vec3ff> *)(local_a8 + 8),(XMLLoader *)xml,
                      (Ref<embree::XML> *)local_70);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)this_00,(avector<Vec3ff> *)(local_a8 + 8));
      alignedFree((void *)local_a0.field_2._8_8_);
      local_a0._M_string_length = 0;
      local_a0.field_2._M_allocated_capacity = 0;
      local_a0.field_2._8_8_ = (void *)0x0;
      if ((string *)local_70._0_8_ != (string *)0x0) {
        (**(code **)(((_Alloc_hider *)local_70._0_8_)->_M_p + 0x18))();
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                      *)((long)local_a8 + 0x80))->
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                      *)((long)local_a8 + 0x80))->
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_a8 != (undefined1  [8])0x0) {
    (*((RefCount *)local_a8)->_vptr_RefCount[3])();
  }
  psVar3 = *(string **)local_78._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a8 + 8),"animated_normals","");
  XML::childOpt((XML *)local_70,psVar3);
  sig = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
    sig = extraout_RDX_00;
  }
  if ((string *)local_70._0_8_ == (string *)0x0) {
    psVar3 = *(string **)local_78._M_p;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_a8 + 8),"normals","");
    pPVar1 = local_80;
    XML::childOpt((XML *)local_a8,psVar3);
    sig = extraout_RDX_03;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
      sig = extraout_RDX_04;
    }
    if (local_a8 != (undefined1  [8])0x0) {
      loadVec3faArray((avector<Vec3fa> *)(local_a8 + 8),(XMLLoader *)xml,
                      (Ref<embree::XML> *)local_a8);
      psVar3 = (string *)(local_a8 + 8);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)&pPVar1->normals,
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 psVar3);
      alignedFree((void *)local_a0.field_2._8_8_);
      sig = extraout_RDX_05;
    }
    if (local_a8 != (undefined1  [8])0x0) {
      (*((RefCount *)local_a8)->_vptr_RefCount[3])();
      sig = extraout_RDX_06;
    }
  }
  else {
    psVar3 = (string *)local_70._0_8_;
    if ((pointer)((string *)(local_70._0_8_ + 0x80))->_M_string_length !=
        (((string *)(local_70._0_8_ + 0x80))->_M_dataplus)._M_p) {
      this_01 = &local_80->normals;
      uVar2 = 0;
      do {
        XML::child((XML *)local_a8,local_70._0_8_);
        loadVec3faArray((avector<Vec3fa> *)(local_a8 + 8),(XMLLoader *)xml,
                        (Ref<embree::XML> *)local_a8);
        std::
        vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    *)this_01,(avector<Vec3fa> *)(local_a8 + 8));
        alignedFree((void *)local_a0.field_2._8_8_);
        local_a0._M_string_length = 0;
        local_a0.field_2._M_allocated_capacity = 0;
        local_a0.field_2._8_8_ = (void *)0x0;
        sig = extraout_RDX_01;
        if (local_a8 != (undefined1  [8])0x0) {
          (*((RefCount *)local_a8)->_vptr_RefCount[3])();
          sig = extraout_RDX_02;
        }
        uVar2 = uVar2 + 1;
        psVar3 = (string *)local_70._0_8_;
      } while (uVar2 < (ulong)((long)(((string *)(local_70._0_8_ + 0x80))->_M_string_length -
                                     (long)(((string *)(local_70._0_8_ + 0x80))->_M_dataplus)._M_p)
                              >> 3));
    }
  }
  if ((string *)local_70._0_8_ != (string *)0x0) {
    (**(code **)(((_Alloc_hider *)local_70._0_8_)->_M_p + 0x18))();
    sig = extraout_RDX_07;
  }
  pPVar1 = local_80;
  SceneGraph::PointSetNode::verify(local_80,(EVP_PKEY_CTX *)psVar3,sig,siglen,in_R8,in_R9);
  (local_38->path).filename._M_dataplus._M_p = (pointer)pPVar1;
  (**(code **)((long)(pPVar1->super_Node).super_RefCount._vptr_RefCount + 0x10))(pPVar1);
  (**(code **)((long)(pPVar1->super_Node).super_RefCount._vptr_RefCount + 0x18))(pPVar1);
  if ((_Base_ptr)local_40._M_p != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_40._M_p + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)local_38;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadPoints(const Ref<XML>& xml, RTCGeometryType type)
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::PointSetNode> mesh = new SceneGraph::PointSetNode(type,material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->positions.push_back(loadVec3ffArray(animation->child(i)));
      }
    } else {
      mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions")));
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
      }
    } else if (Ref<XML> normals = xml->childOpt("normals")) {
      mesh->normals.push_back(loadVec3faArray(normals));
    }

    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }